

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O2

Container * __thiscall Container::add(Container *this,Person *person)

{
  Person *local_10;
  
  local_10 = person;
  std::__cxx11::list<Person_*,_std::allocator<Person_*>_>::push_back(&this->people,&local_10);
  return this;
}

Assistant:

Container& Container::add(Person* person){
    people.push_back(person);
    return *this;
}